

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.hpp
# Opt level: O1

void __thiscall ot::commissioner::JoinerSession::~JoinerSession(JoinerSession *this)

{
  _Atomic_word *p_Var1;
  RequestHandler *pRVar2;
  _Manager_type p_Var3;
  pointer pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer puVar6;
  int iVar7;
  
  p_Var3 = (this->mResourceJoinFin).mHandler.super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    pRVar2 = &(this->mResourceJoinFin).mHandler;
    (*p_Var3)((_Any_data *)pRVar2,(_Any_data *)pRVar2,__destroy_functor);
  }
  pcVar4 = (this->mResourceJoinFin).mUriPath._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != &(this->mResourceJoinFin).mUriPath.field_2) {
    operator_delete(pcVar4);
  }
  coap::Coap::~Coap(&this->mCoap);
  p_Var5 = (this->mDtlsSession).
           super___shared_ptr<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  p_Var5 = (this->mRelaySocket).
           super___shared_ptr<ot::commissioner::JoinerSession::RelaySocket,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  pcVar4 = (this->mJoinerPSKd)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != &(this->mJoinerPSKd).field_2) {
    operator_delete(pcVar4);
  }
  puVar6 = (this->mJoinerId).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar6 != (pointer)0x0) {
    operator_delete(puVar6);
  }
  p_Var5 = (this->super_enable_shared_from_this<ot::commissioner::JoinerSession>)._M_weak_this.
           super___weak_ptr<ot::commissioner::JoinerSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var5->_M_weak_count;
      iVar7 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar7 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar7 + -1;
    }
    if (iVar7 == 1) {
      (*p_Var5->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

~JoinerSession()                                      = default;